

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String __thiscall doctest::detail::fpToString<double>(detail *this,double value,int precision)

{
  long lVar1;
  string d;
  ostringstream oss;
  char *local_1d0;
  long local_1c8;
  char local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  long local_190;
  long local_188 [2];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  *(long *)((long)local_188 + *(long *)(local_190 + -0x18)) = (long)precision;
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(value);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)&local_1d0,0x30);
  if ((lVar1 != -1) && (lVar1 != local_1c8 + -1)) {
    std::__cxx11::string::substr((ulong)local_1b0,(ulong)&local_1d0);
    std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_1b0);
    if (local_1b0[0] != local_1a0) {
      operator_delete(local_1b0[0]);
    }
  }
  String::String((String *)this,local_1d0);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::ios_base::~ios_base(local_120);
  return (String)(char *)this;
}

Assistant:

String fpToString(T value, int precision) {
        std::ostringstream oss;
        oss << std::setprecision(precision) << std::fixed << value;
        std::string d = oss.str();
        size_t      i = d.find_last_not_of('0');
        if(i != std::string::npos && i != d.size() - 1) {
            if(d[i] == '.')
                i++;
            d = d.substr(0, i + 1);
        }
        return d.c_str();
    }